

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Cancel_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Resupply_Cancel_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Resupply_Cancel_PDU *this)

{
  ostream *poVar1;
  ulong uVar2;
  char cVar3;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar1 = std::operator<<(local_330,(string *)&local_360);
  poVar1 = std::operator<<(poVar1,"-Resupply Cancel-\n");
  Logistics_Header::GetAsString_abi_cxx11_(&local_3a0,&this->super_Logistics_Header);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar2 = 0;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if (local_3a0._M_string_length <= uVar2) break;
    cVar3 = local_3a0._M_dataplus._M_p[uVar2];
    if (local_3a0._M_string_length - 1 != uVar2 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar3);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::operator<<(poVar1,local_380);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Resupply_Cancel_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Resupply Cancel-\n"
       << IndentString( Logistics_Header::GetAsString(), 1 );

    return ss.str();
}